

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::MemPattern::TryToGenerateCode
          (MemPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstMemPtr pCVar1;
  AssemblyCommands *this_00;
  ChildrenTemps *__args_1;
  CExpression *pCVar2;
  CTempExpression *local_110;
  ConstTempPtr local_100;
  undefined1 local_f0 [16];
  CExpression *local_e0;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_d8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_b0;
  undefined1 local_88 [8];
  CTemp source;
  undefined1 local_58 [24];
  ConstTempPtr constTempPtr;
  ConstMemPtr memPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  MemPattern *this_local;
  
  memPtr = (ConstMemPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_100 = (ConstTempPtr)0x0;
  }
  else {
    local_100 = (ConstTempPtr)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
  }
  constTempPtr = local_100;
  if (local_100 == (ConstTempPtr)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pCVar2 = CMemExpression::getAddress((CMemExpression *)local_100);
    if (pCVar2 == (CExpression *)0x0) {
      local_110 = (CTempExpression *)0x0;
    }
    else {
      local_110 = (CTempExpression *)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    __args_1 = children_local;
    pCVar1 = memPtr;
    local_58._16_8_ = local_110;
    if (local_110 == (CTempExpression *)0x0) {
      CTemp::CTemp((CTemp *)local_88);
      this_00 = commands_local;
      local_e0 = CMemExpression::getAddress((CMemExpression *)constTempPtr);
      std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_d8,(CTemp *)local_88,&local_e0);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                (&local_b0,&local_d8);
      std::
      vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
      ::push_back((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                   *)this_00,&local_b0);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_b0);
      std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_d8);
      pCVar1 = memPtr;
      std::make_shared<AssemblyCode::MoveRegMemCommand,IRT::CTemp_const&,IRT::CTemp&>
                ((CTemp *)local_f0,(CTemp *)children_local);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_f0);
      std::shared_ptr<AssemblyCode::MoveRegMemCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_f0);
      CTemp::~CTemp((CTemp *)local_88);
    }
    else {
      CTempExpression::getTemprorary(local_110);
      std::make_shared<AssemblyCode::MoveRegMemCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                ((CTemp *)local_58,(CTemp *)__args_1);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)pCVar1,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_58);
      std::shared_ptr<AssemblyCode::MoveRegMemCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_58);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool IRT::MemPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                         AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(memPtr->getAddress( ));
        if ( constTempPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, constTempPtr->getTemprorary( )));
        } else {
            CTemp source;
            children.push_back( std::make_pair( source, memPtr->getAddress( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, source ));
        }
        return true;
    }
    return false;
}